

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O0

void fill_approximation(double *G,double *V,double *solutions,uint total_values)

{
  uint local_28;
  uint space_step;
  uint total_values_local;
  double *solutions_local;
  double *V_local;
  double *G_local;
  
  for (local_28 = 0; local_28 < total_values; local_28 = local_28 + 1) {
    G[local_28] = solutions[local_28 << 1];
    V[local_28] = solutions[local_28 * 2 + 1];
  }
  V[total_values - 1] = 0.0;
  *V = 0.0;
  return;
}

Assistant:

void fill_approximation (double * G, double * V, double const * solutions, unsigned total_values) {
  register unsigned space_step = 0;

  for (space_step = 0; space_step < total_values; ++space_step) {
    G[space_step] = solutions[G_INDEX(space_step)];
    V[space_step] = solutions[V_INDEX(space_step)];
  }
  V[0] = V[total_values - 1] = 0.;

  return;
}